

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O2

var __thiscall cs::runtime_type::parse_access(runtime_type *this,var *a,var *b)

{
  size_type sVar1;
  proxy *ppVar2;
  longdouble lVar3;
  bool bVar4;
  type_info *ptVar5;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_00;
  numeric *pnVar6;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_01;
  size_t sVar7;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
  *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  size_type sVar9;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *this_03;
  runtime_error *prVar10;
  MappedConstReference<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>_> paVar11;
  numeric_integer nVar12;
  any *in_RCX;
  char *args;
  ulong uVar13;
  ulong __n;
  anon_union_16_2_310e9938_for_data local_d8;
  undefined1 local_c8;
  any local_b8;
  longdouble local_ac;
  any local_a0;
  ulong local_98;
  undefined2 uStack_90;
  ulong local_88;
  long local_80;
  size_type local_78;
  long local_70;
  long local_68;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>::iterator,_bool>
  local_60;
  longdouble local_48;
  
  ptVar5 = cs_impl::any::type(b);
  bVar4 = std::type_info::operator==
                    (ptVar5,(type_info *)
                            &std::deque<cs_impl::any,std::allocator<cs_impl::any>>::typeinfo);
  if (!bVar4) {
    ptVar5 = cs_impl::any::type(b);
    bVar4 = std::type_info::operator==
                      (ptVar5,(type_info *)
                              &phmap::
                               flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                               ::typeinfo);
    if (bVar4) {
      this_01 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                 *)cs_impl::any::
                   const_val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                             (b);
      sVar7 = phmap::priv::
              raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
              ::count<cs_impl::any>(this_01,in_RCX);
      if (sVar7 == 0) {
        this_02 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
                   *)cs_impl::any::
                     val<phmap::flat_hash_map<cs_impl::any,cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>>
                               (b);
        local_a0.mDat = in_RCX->mDat;
        if (local_a0.mDat != (proxy *)0x0) {
          (local_a0.mDat)->refcount = (local_a0.mDat)->refcount + 1;
        }
        copy((EVP_PKEY_CTX *)&local_b8,(EVP_PKEY_CTX *)&local_a0);
        local_c8 = 1;
        local_d8._int = 0;
        phmap::priv::
        raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs_impl::any>_>_>
        ::emplace<cs_impl::any,_cs::numeric,_0>(&local_60,this_02,&local_b8,(numeric *)&local_d8);
        cs_impl::any::recycle(&local_b8);
        cs_impl::any::recycle(&local_a0);
      }
      paVar11 = phmap::priv::
                raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                ::at<cs_impl::any,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>>
                          ((raw_hash_map<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs_impl::any>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs_impl::any>>>
                            *)this_01,in_RCX);
      goto LAB_002aff1b;
    }
    ptVar5 = cs_impl::any::type(b);
    bVar4 = std::type_info::operator==(ptVar5,(type_info *)&std::__cxx11::string::typeinfo);
    if (!bVar4) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_d8,"Access non-array or string object.",(allocator *)&local_60);
      runtime_error::runtime_error(prVar10,(string *)&local_d8);
      __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    ptVar5 = cs_impl::any::type(in_RCX);
    bVar4 = std::type_info::operator!=(ptVar5,(type_info *)&numeric::typeinfo);
    if (bVar4) {
      prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&local_d8,"Index must be a numeric.",(allocator *)&local_60);
      runtime_error::runtime_error(prVar10,(string *)&local_d8);
      __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    pbVar8 = cs_impl::any::const_val<std::__cxx11::string>(b);
    pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    if (pnVar6->type == true) {
      if ((pnVar6->data)._int < 0) {
LAB_002afde9:
        sVar1 = pbVar8->_M_string_length;
        pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
        local_68 = (long)ROUND(*(longdouble *)&pnVar6->data);
        nVar12 = local_68;
        if (pnVar6->type != false) {
          nVar12 = (pnVar6->data)._int;
        }
        args = (pbVar8->_M_dataplus)._M_p + nVar12 + sVar1;
        goto LAB_002aff4d;
      }
    }
    else if (*(longdouble *)&pnVar6->data < (longdouble)0) goto LAB_002afde9;
    pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    local_70 = (long)ROUND(*(longdouble *)&pnVar6->data);
    nVar12 = local_70;
    if (pnVar6->type != false) {
      nVar12 = (pnVar6->data)._int;
    }
    args = (pbVar8->_M_dataplus)._M_p + nVar12;
LAB_002aff4d:
    cs_impl::any::make_constant<char,char_const&>((any *)this,args);
    return (var)(proxy *)this;
  }
  ptVar5 = cs_impl::any::type(in_RCX);
  bVar4 = std::type_info::operator!=(ptVar5,(type_info *)&numeric::typeinfo);
  if (bVar4) {
    prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_d8,"Index must be a numeric.",(allocator *)&local_60);
    runtime_error::runtime_error(prVar10,(string *)&local_d8);
    __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  this_00 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(b);
  pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
  if (pnVar6->type == true) {
    if (-1 < (pnVar6->data)._int) goto LAB_002afbbf;
LAB_002afd52:
    pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    bVar4 = pnVar6->type;
    if (bVar4 == true) {
      local_98 = -(pnVar6->data)._int;
      uStack_90 = 0;
      local_ac = (longdouble)(unkuint10)local_98;
    }
    else {
      local_ac = -*(longdouble *)&pnVar6->data;
    }
    sVar9 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
    if (bVar4 == false) {
      local_78 = sVar9;
      if ((longdouble)(long)sVar9 +
          (longdouble)*(float *)(&DAT_00308188 + (ulong)((long)sVar9 < 0) * 4) < local_ac)
      goto LAB_002afeb8;
    }
    else {
      local_48 = local_ac;
      lVar3 = local_48;
      local_48._0_8_ = SUB108(local_ac,0);
      bVar4 = sVar9 < local_48._0_8_;
      local_48 = lVar3;
      if (bVar4) {
LAB_002afeb8:
        prVar10 = (runtime_error *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_d8,"Out of range.",(allocator *)&local_60);
        runtime_error::runtime_error(prVar10,(string *)&local_d8);
        __cxa_throw(prVar10,&runtime_error::typeinfo,runtime_error::~runtime_error);
      }
    }
    sVar9 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
    pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    local_80 = (long)ROUND(*(longdouble *)&pnVar6->data);
    nVar12 = local_80;
    if (pnVar6->type != false) {
      nVar12 = (pnVar6->data)._int;
    }
    __n = nVar12 + sVar9;
  }
  else {
    if (*(longdouble *)&pnVar6->data < (longdouble)0) goto LAB_002afd52;
LAB_002afbbf:
    pnVar6 = cs_impl::any::const_val<cs::numeric>(in_RCX);
    local_88 = (ulong)ROUND(*(longdouble *)&pnVar6->data);
    __n = local_88;
    if (pnVar6->type != false) {
      __n = (pnVar6->data)._int;
    }
    sVar9 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_00);
    if (sVar9 <= __n) {
      this_03 = cs_impl::any::val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>(b);
      sVar9 = std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::size(this_03);
      for (uVar13 = sVar9 - 1; __n != uVar13; uVar13 = uVar13 + 1) {
        local_c8 = 1;
        local_d8._int = 0;
        std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs::numeric>
                  (this_03,(numeric *)&local_d8);
      }
    }
  }
  paVar11 = std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>::operator[]
                      (&(this_00->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                        _M_impl.super__Deque_impl_data._M_start,__n);
LAB_002aff1b:
  ppVar2 = paVar11->mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  (this->literals).
  super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .
  super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  .ctrl_ = &ppVar2->is_rvalue;
  return (var)(proxy *)this;
}

Assistant:

var runtime_type::parse_access(const var &a, const var &b)
	{
		if (a.type() == typeid(array)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &carr = a.const_val<array>();
			std::size_t posit = 0;
			if (b.const_val<numeric>() >= 0) {
				posit = b.const_val<numeric>().as_integer();
				if (posit >= carr.size()) {
					auto &arr = a.val<array>();
					for (std::size_t i = posit - arr.size() + 1; i > 0; --i)
						arr.emplace_back(numeric(0));
				}
			}
			else {
				if (-b.const_val<numeric>() > carr.size())
					throw runtime_error("Out of range.");
				posit = carr.size() + b.const_val<numeric>().as_integer();
			}
			return carr[posit];
		}
		else if (a.type() == typeid(hash_map)) {
			const auto &cmap = a.const_val<hash_map>();
			if (cmap.count(b) == 0)
				a.val<hash_map>().emplace(copy(b), numeric(0));
			return cmap.at(b);
		}
		else if (a.type() == typeid(string)) {
			if (b.type() != typeid(numeric))
				throw runtime_error("Index must be a numeric.");
			const auto &cstr = a.const_val<string>();
			if (b.const_val<numeric>() >= 0)
				return var::make_constant<char>(cstr[b.const_val<numeric>().as_integer()]);
			else
				return var::make_constant<char>(cstr[cstr.size() + b.const_val<numeric>().as_integer()]);
		}
		else
			throw runtime_error("Access non-array or string object.");
	}